

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::add_neighbor_features(search_private *priv,multi_ex *ec_seq)

{
  uint uVar1;
  vw *pvVar2;
  float *pfVar3;
  uint64_t uVar4;
  char cVar5;
  pointer ppeVar6;
  int *piVar7;
  ostream *poVar8;
  char cVar9;
  ulong uVar10;
  uint uVar11;
  float *pfVar12;
  uint32_t *puVar13;
  long lVar14;
  example *peVar15;
  long *plVar16;
  ulong uVar17;
  int iVar18;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  ostream *local_50;
  example *local_48;
  string *local_40;
  ulong local_38;
  
  if (((priv->neighbor_features)._end != (priv->neighbor_features)._begin) &&
     (ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
     (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
     super__Vector_impl_data._M_finish != ppeVar6)) {
    pvVar2 = priv->all;
    local_40 = (string *)&priv->field_0x370;
    local_50 = (ostream *)&priv->field_0x368;
    puVar13 = &(pvVar2->weights).dense_weights._stride_shift;
    if ((pvVar2->weights).sparse != false) {
      puVar13 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    local_38 = (ulong)*puVar13;
    uVar10 = 0;
    do {
      piVar7 = (priv->neighbor_features)._begin;
      peVar15 = ppeVar6[uVar10];
      if ((priv->neighbor_features)._end != piVar7) {
        uVar17 = 0;
        local_48 = ppeVar6[uVar10];
        do {
          uVar1 = piVar7[uVar17];
          iVar18 = (int)uVar1 >> 0x18;
          uVar11 = uVar1 & 0xff;
          priv->dat_new_feature_ec = local_48;
          priv->dat_new_feature_value = 1.0;
          priv->dat_new_feature_idx = (long)piVar7[uVar17] * 0xd1c79f;
          priv->dat_new_feature_namespace = 0x83;
          if (priv->all->audit == true) {
            priv->dat_new_feature_feature_space = (string *)neighbor_feature_space_abi_cxx11_;
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
            std::__cxx11::stringbuf::str(local_40);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            local_70[0]._0_1_ = (string)0x40;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_50,(char *)local_70,1)
            ;
            local_70[0]._0_1_ = (string)((iVar18 < 1) * '\x02' + '+');
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_70,1);
            cVar5 = (char)(uVar1 >> 0x18);
            cVar9 = -cVar5;
            if (0 < iVar18) {
              cVar9 = cVar5;
            }
            local_70[0] = (undefined1 *)CONCAT71(local_70[0]._1_7_,cVar9 + '0');
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_70,1);
            if (uVar11 != 0x20) {
              local_70[0] = (undefined1 *)CONCAT71(local_70[0]._1_7_,(char)uVar1);
              std::__ostream_insert<char,std::char_traits<char>>(local_50,(char *)local_70,1);
            }
          }
          lVar14 = 0x372faf1d;
          if (iVar18 < 0 && uVar10 < (uint)-iVar18) {
LAB_00121aa3:
            add_new_feature(priv,1.0,lVar14 << ((byte)local_38 & 0x3f));
          }
          else {
            ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar14 = 0x3a5d15;
            if ((ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6 >> 3) <=
                (long)iVar18 + uVar10) goto LAB_00121aa3;
            peVar15 = ppeVar6[(long)iVar18 + uVar10];
            pfVar12 = *(float **)((peVar15->super_example_predict).feature_space + uVar11);
            pfVar3 = *(float **)
                      ((long)((peVar15->super_example_predict).feature_space + uVar11) + 8);
            if (pfVar12 != pfVar3) {
              uVar4 = (local_48->super_example_predict).ft_offset;
              plVar16 = *(long **)((long)((peVar15->super_example_predict).feature_space + uVar11) +
                                  0x20);
              do {
                add_new_feature(priv,*pfVar12,*plVar16 + uVar4);
                pfVar12 = pfVar12 + 1;
                plVar16 = plVar16 + 1;
              } while (pfVar12 != pfVar3);
            }
          }
          uVar17 = uVar17 + 1;
          piVar7 = (priv->neighbor_features)._begin;
          peVar15 = local_48;
        } while (uVar17 < (ulong)((long)(priv->neighbor_features)._end - (long)piVar7 >> 2));
      }
      lVar14 = (long)(peVar15->super_example_predict).feature_space[0x83].values._end -
               (long)(peVar15->super_example_predict).feature_space[0x83].values._begin;
      if ((lVar14 == 0) || ((peVar15->super_example_predict).feature_space[0x83].sum_feat_sq <= 0.0)
         ) {
        features::clear((peVar15->super_example_predict).feature_space + 0x83);
      }
      else {
        v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar15,&neighbor_namespace);
        peVar15->total_sum_feat_sq =
             (peVar15->super_example_predict).feature_space[0x83].sum_feat_sq +
             peVar15->total_sum_feat_sq;
        peVar15->num_features = peVar15->num_features + (lVar14 >> 2);
      }
      uVar10 = uVar10 + 1;
      ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6 >> 3))
    ;
  }
  return;
}

Assistant:

void add_neighbor_features(search_private& priv, multi_ex& ec_seq)
{
  if (priv.neighbor_features.size() == 0)
    return;

  uint32_t stride_shift = priv.all->weights.stride_shift();
  for (size_t n = 0; n < ec_seq.size(); n++)  // iterate over every example in the sequence
  {
    example& me = *ec_seq[n];
    for (size_t n_id = 0; n_id < priv.neighbor_features.size(); n_id++)
    {
      int32_t offset = priv.neighbor_features[n_id] >> 24;
      size_t ns = priv.neighbor_features[n_id] & 0xFF;

      priv.dat_new_feature_ec = &me;
      priv.dat_new_feature_value = 1.;
      priv.dat_new_feature_idx = priv.neighbor_features[n_id] * 13748127;
      priv.dat_new_feature_namespace = neighbor_namespace;
      if (priv.all->audit)
      {
        priv.dat_new_feature_feature_space = &neighbor_feature_space;
        priv.dat_new_feature_audit_ss.str("");
        priv.dat_new_feature_audit_ss << '@' << ((offset > 0) ? '+' : '-') << (char)(abs(offset) + '0');
        if (ns != ' ')
          priv.dat_new_feature_audit_ss << (char)ns;
      }

      // cerr << "n=" << n << " offset=" << offset << endl;
      if ((offset < 0) && (n < (uint64_t)(-offset)))  // add <s> feature
        add_new_feature(priv, 1., (uint64_t)925871901 << stride_shift);
      else if (n + offset >= ec_seq.size())  // add </s> feature
        add_new_feature(priv, 1., (uint64_t)3824917 << stride_shift);
      else  // this is actually a neighbor
      {
        example& other = *ec_seq[n + offset];
        GD::foreach_feature<search_private, add_new_feature>(priv.all, other.feature_space[ns], priv, me.ft_offset);
      }
    }

    features& fs = me.feature_space[neighbor_namespace];
    size_t sz = fs.size();
    if ((sz > 0) && (fs.sum_feat_sq > 0.))
    {
      me.indices.push_back(neighbor_namespace);
      me.total_sum_feat_sq += fs.sum_feat_sq;
      me.num_features += sz;
    }
    else
      fs.clear();
  }
}